

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_progname.c
# Opt level: O0

char * zt_progpath(char *prog)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *in_RDI;
  char *pp_1;
  char *tpath_1;
  char cwd_1 [4097];
  char cwd [4097];
  ssize_t sofft;
  char *pp;
  stat sbuf;
  char *tpath;
  size_t len;
  ssize_t base;
  size_t offt;
  char *path;
  undefined4 in_stack_ffffffffffffdee0;
  undefined4 in_stack_ffffffffffffdee4;
  undefined4 in_stack_ffffffffffffdee8;
  undefined4 in_stack_ffffffffffffdeec;
  size_t in_stack_ffffffffffffdef0;
  char *in_stack_ffffffffffffdef8;
  size_t in_stack_ffffffffffffdf00;
  char *in_stack_ffffffffffffdf08;
  ssize_t in_stack_ffffffffffffdf10;
  ssize_t in_stack_ffffffffffffdf18;
  char *in_stack_ffffffffffffdf20;
  char *in_stack_ffffffffffffdf28;
  char *in_stack_ffffffffffffdf30;
  char local_10e8 [4112];
  ssize_t local_d8;
  char *local_d0;
  stat local_c8;
  char *local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  char *local_18;
  char *local_10;
  
  if ((in_RDI != (char *)0x0) && (*in_RDI != '\0')) {
    local_10 = in_RDI;
    memset(_progpath,0,0x1000);
    zt_cstr_dirname(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0,
                    (char *)CONCAT44(in_stack_ffffffffffffdeec,in_stack_ffffffffffffdee8));
    if ((_progpath[0] == '\0') || (iVar1 = strcmp(_progpath,"."), iVar1 == 0)) {
      local_20 = 0;
      local_28 = 0;
      local_18 = getenv("PATH");
      if (local_18 == (char *)0x0) {
        local_d0 = zt_os_progpath();
        if ((local_d0 != (char *)0x0) &&
           (zt_cstr_dirname(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0,
                            (char *)CONCAT44(in_stack_ffffffffffffdeec,in_stack_ffffffffffffdee8)),
           local_d0 != (char *)0x0)) {
          free(local_d0);
        }
      }
      else {
        local_30 = strlen(local_18);
        while ((local_20 < local_30 &&
               (local_d8 = zt_cstr_any(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0,
                                       CONCAT44(in_stack_ffffffffffffdeec,in_stack_ffffffffffffdee8)
                                       ,(char *)CONCAT44(in_stack_ffffffffffffdee4,
                                                         in_stack_ffffffffffffdee0)), -1 < local_d8)
               )) {
          in_stack_ffffffffffffdee0 = 0;
          in_stack_ffffffffffffdee8 = 0xffffffff;
          in_stack_ffffffffffffdef0 = 0;
          local_20 = local_d8;
          local_38 = zt_cstr_catv(local_18,local_28,local_d8 + -1,"/",0,0xffffffff,local_10);
          piVar2 = __errno_location();
          *piVar2 = 0;
          iVar1 = stat(local_38,&local_c8);
          if (iVar1 == 0) {
            zt_cstr_dirname(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0,
                            (char *)CONCAT44(in_stack_ffffffffffffdeec,in_stack_ffffffffffffdee8));
            if (local_38 != (char *)0x0) {
              free(local_38);
            }
            goto LAB_00109fc9;
          }
          if (local_38 != (char *)0x0) {
            free(local_38);
            local_38 = (char *)0x0;
          }
          local_28 = local_20 + 1;
          local_20 = local_20 + 1;
        }
        iVar1 = strcmp(_progpath,".");
        if ((iVar1 == 0) && (pcVar3 = getcwd(local_10e8,0x1000), pcVar3 != (char *)0x0)) {
          zt_cstr_copy(in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf10
                       ,in_stack_ffffffffffffdf08,in_stack_ffffffffffffdf00);
        }
      }
    }
    else {
      pcVar3 = getcwd(&stack0xffffffffffffdf08,0x1000);
      if ((pcVar3 != (char *)0x0) && (_progpath[0] != '/')) {
        pcVar3 = zt_cstr_path_append(in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28);
        zt_cstr_copy(in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf10,
                     in_stack_ffffffffffffdf08,(size_t)pcVar3);
        if (pcVar3 != (char *)0x0) {
          free(pcVar3);
        }
      }
    }
  }
LAB_00109fc9:
  return _progpath;
}

Assistant:

char *
zt_progpath(char *prog) {

    /* If prog is !NULL then try to calculate the correct path.
     * Otherwise just return the current path setting.
     */
    if(prog && *prog != '\0') {
        /* if the passed in path is not NULL */
        memset(_progpath, '\0', PATH_MAX);
        zt_cstr_dirname(_progpath, PATH_MAX, prog);

        if(_progpath[0] == '\0' || strcmp(_progpath, ".") == 0) {
            /* the passed in prog did not include a path */
            char        * path;
            size_t        offt = 0;
            ssize_t       base = 0;
            size_t        len;
            char        * tpath;
            struct stat   sbuf;

            path = getenv("PATH");

            if (!path) {
                /* try to use system specific methods to get the path */
                char    * pp;

                if ((pp = zt_os_progpath()) == NULL) {
                    return _progpath;
                }

                zt_cstr_dirname(_progpath, PATH_MAX, pp);
                zt_free(pp);
                return _progpath;
            }

            len = strlen(path);
            while(offt < len) {
                ssize_t   sofft;

                if ((sofft = zt_cstr_any(path, offt, -1, ENV_SEPERATOR)) < 0) {
                    break;
                }
                offt = (size_t)sofft;
                tpath = zt_cstr_catv(path, base, offt-1,
                                     PATH_SEPERATOR, 0, -1,
                                     prog, 0, -1, NULL);

                errno = 0;
                if((stat(tpath, &sbuf) == 0)) {
                    zt_cstr_dirname(_progpath, PATH_MAX, tpath);
                    zt_free(tpath);
                    return _progpath;
                }
                zt_free(tpath);
                base = offt+1;
                offt++;
            }

            /* if still no path */
            if (strcmp(_progpath, ".") == 0) {
                /* just return the cwd */
                char      cwd[PATH_MAX+1];
                if (getcwd(cwd, PATH_MAX) != NULL) {
                    zt_cstr_copy(cwd, 0, -1, _progpath, PATH_MAX);
                }
            }
        } else {
            /* the passed in path did include a path
             * determine if it is relative
             */
            char      cwd[PATH_MAX+1];

            if(getcwd(cwd, PATH_MAX) != NULL) {
                if (_progpath[0] != '/') {
                    /* path is relative append and remove prog */
                    char      * tpath;
                    char      * pp = _progpath;

                    if(_progpath[0] == '.' &&  _progpath[1] == '/') {
                        /* if it starts with ./ then remove it */
                        pp += 2;
                    }

                    tpath = zt_cstr_path_append(cwd, pp);
                    zt_cstr_copy(tpath, 0, -1, _progpath, PATH_MAX);
                    zt_free(tpath);
                }
            }
        }
    }
    return _progpath;
}